

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsHessian_ASA_FSA.c
# Opt level: O1

int fQB2(sunrealtype t,N_Vector y,N_Vector *yS,N_Vector yB,N_Vector qBdot,void *user_dataB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double dVar15;
  
  dVar1 = *(double *)((long)user_dataB + 8);
  pdVar12 = *(double **)((long)y->content + 0x10);
  dVar2 = pdVar12[1];
  dVar3 = pdVar12[2];
  pdVar13 = *(double **)((long)yS[1]->content + 0x10);
  pdVar14 = *(double **)((long)yB->content + 0x10);
  dVar4 = *pdVar14;
  dVar5 = *pdVar12;
  pdVar12 = *(double **)((long)qBdot->content + 0x10);
  dVar15 = dVar3 * dVar1 * -2.0 * dVar2;
  dVar6 = pdVar14[2];
  dVar7 = pdVar13[2];
  dVar8 = pdVar13[1];
  dVar9 = *pdVar13;
  dVar10 = pdVar14[3];
  dVar11 = pdVar14[5];
  *pdVar12 = dVar4 * dVar5 * -dVar5;
  pdVar12[1] = dVar6 * dVar15;
  pdVar12[2] = dVar10 * dVar5 * -dVar5 + dVar4 * -2.0 * dVar5 * dVar9;
  pdVar12[3] = dVar11 * dVar15 +
               dVar6 * -2.0 * (dVar2 * dVar3 + dVar1 * dVar3 * dVar8 + dVar1 * dVar2 * dVar7);
  return 0;
}

Assistant:

static int fQB2(sunrealtype t, N_Vector y, N_Vector* yS, N_Vector yB,
                N_Vector qBdot, void* user_dataB)
{
  UserData data;
  sunrealtype p2;
  sunrealtype y1, y2, y3; /* solution */
  sunrealtype s1, s2, s3; /* sensitivity 2 */
  sunrealtype l1, l3;     /* lambda */
  sunrealtype m1, m3;     /* mu */

  data = (UserData)user_dataB;

  p2 = data->p2;

  y1 = Ith(y, 1);
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  s1 = Ith(yS[1], 1);
  s2 = Ith(yS[1], 2);
  s3 = Ith(yS[1], 3);

  l1 = Ith(yB, 1);
  l3 = Ith(yB, 3);

  m1 = Ith(yB, 4);
  m3 = Ith(yB, 6);

  Ith(qBdot, 1) = -y1 * y1 * l1;
  Ith(qBdot, 2) = -2.0 * p2 * y2 * y3 * l3;

  Ith(qBdot, 3) = -y1 * y1 * m1 - l1 * 2.0 * y1 * s1;
  Ith(qBdot, 4) = -2.0 * p2 * y2 * y3 * m3 -
                  l3 * 2.0 * (p2 * y3 * s2 + p2 * y2 * s3 + y2 * y3);

  return (0);
}